

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

bool ImNodes::IsConnectingCompatibleSlot(void)

{
  long lVar1;
  int iVar2;
  ImGuiPayload *pIVar3;
  ulong uVar4;
  uint *puVar5;
  byte unaff_BPL;
  ulong uVar6;
  char drag_id [32];
  char acStack_48 [40];
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x32f,"bool ImNodes::IsConnectingCompatibleSlot()");
  }
  lVar1 = *(long *)(gCanvas + 0x98);
  pIVar3 = ImGui::GetDragDropPayload();
  if ((pIVar3 != (ImGuiPayload *)0x0) && (unaff_BPL = 0, *pIVar3->Data != *(long *)(lVar1 + 0x10)))
  {
    snprintf(acStack_48,0x20,"new-node-connection-%08X",(ulong)(uint)-*(int *)(lVar1 + 0x28));
    iVar2 = strcmp(acStack_48,pIVar3->DataType);
    if (iVar2 == 0) {
      uVar4 = (ulong)*(int *)(lVar1 + 0x98);
      if ((long)uVar4 < 1) {
        unaff_BPL = 1;
      }
      else {
        puVar5 = (uint *)(*(long *)(lVar1 + 0xa0) + 0x10);
        uVar6 = 0;
        do {
          if ((*(long *)(puVar5 + -4) == *(long *)(lVar1 + 0x10)) &&
             (-1 < (int)(*(uint *)(lVar1 + 0x28) ^ *puVar5))) {
            unaff_BPL = 0;
            goto LAB_001525f1;
          }
          uVar6 = uVar6 + 1;
          puVar5 = puVar5 + 6;
        } while (uVar4 != uVar6);
        unaff_BPL = uVar4 <= uVar6;
      }
    }
  }
LAB_001525f1:
  return (bool)(pIVar3 != (ImGuiPayload *)0x0 & unaff_BPL);
}

Assistant:

bool IsConnectingCompatibleSlot()
{
    assert(gCanvas != nullptr);
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (auto* payload = ImGui::GetDragDropPayload())
    {
        auto* drag_payload = (_DragConnectionPayload*)payload->Data;

        if (drag_payload->node_id == impl->node.id)
            // Node can not connect to itself
            return false;

        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind * -1);
        if (strcmp(drag_id, payload->DataType) != 0)
            return false;

        for (int i = 0; i < impl->ignore_connections.size(); i++)
        {
            const _IgnoreSlot& ignored = impl->ignore_connections[i];
            if (ignored.node_id == impl->node.id && strcmp(ignored.slot_name, ignored.slot_name) == 0 &&
                IsInputSlotKind(ignored.slot_kind) == IsInputSlotKind(impl->slot.kind))
                return false;
        }

        return true;
    }

    return false;
}